

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O3

bool __thiscall libcellml::Model::fixVariableInterfaces(Model *this)

{
  pointer psVar1;
  bool bVar2;
  InterfaceType interfaceType;
  size_t sVar3;
  bool bVar4;
  VariablePtrs *__range1;
  shared_ptr<libcellml::Variable> *variable;
  pointer variable_00;
  ulong uVar5;
  VariablePtrs variables;
  VariablePtrs local_58;
  ComponentEntity local_38;
  
  local_58.
  super__Vector_base<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (VariablePtr *)0x0;
  local_58.
  super__Vector_base<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (VariablePtr *)0x0;
  local_58.
  super__Vector_base<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar5 = 0;
  while( true ) {
    sVar3 = ComponentEntity::componentCount(&this->super_ComponentEntity);
    psVar1 = local_58.
             super__Vector_base<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (sVar3 <= uVar5) break;
    ComponentEntity::component(&local_38,(size_t)this);
    findAllVariablesWithEquivalences((ComponentPtr *)&local_38,&local_58);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_38.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_38.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
    }
    uVar5 = uVar5 + 1;
  }
  bVar4 = true;
  for (variable_00 = local_58.
                     super__Vector_base<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; variable_00 != psVar1;
      variable_00 = variable_00 + 1) {
    interfaceType = determineInterfaceType(variable_00);
    if (interfaceType == NONE) {
      bVar4 = false;
    }
    else {
      bVar2 = Variable::permitsInterfaceType
                        ((variable_00->
                         super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                         ,interfaceType);
      if (!bVar2) {
        Variable::setInterfaceType
                  ((variable_00->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr,interfaceType);
      }
    }
  }
  std::
  vector<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>
  ::~vector(&local_58);
  return bVar4;
}

Assistant:

bool Model::fixVariableInterfaces()
{
    VariablePtrs variables;

    for (size_t index = 0; index < componentCount(); ++index) {
        findAllVariablesWithEquivalences(component(index), variables);
    }

    bool allOk = true;
    for (const auto &variable : variables) {
        Variable::InterfaceType interfaceType = determineInterfaceType(variable);
        if (interfaceType == Variable::InterfaceType::NONE) {
            allOk = false;
        } else if (!variable->permitsInterfaceType(interfaceType)) {
            variable->setInterfaceType(interfaceType);
        }
    }

    return allOk;
}